

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockHouseholder.h
# Opt level: O2

void Eigen::internal::
     make_block_householder_triangular_factor<Eigen::Matrix<float,_1,_1,1,_1,_1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>const,_1,1,false>>
               (Matrix<float,__1,__1,_1,__1,__1> *triFactor,
               Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *vectors,
               Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false> *hCoeffs)

{
  float fVar1;
  float fVar2;
  Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *xpr;
  Scalar *pSVar3;
  Index j;
  long lVar4;
  ulong col;
  Type *pTVar5;
  Rhs *pRVar6;
  ulong index;
  long lVar7;
  byte bVar8;
  CoeffReturnType CVar9;
  CoeffReturnType local_54c;
  Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *local_548;
  DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
  *local_540;
  ulong local_538;
  long local_530;
  Type *local_528;
  Scalar z;
  Block<const_Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>
  local_4b8;
  DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>_> local_450 [56];
  Type local_418;
  StorageBaseType local_380 [152];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>
  local_2e8;
  Type local_228;
  Type local_1c0;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>,_Eigen::TriangularView<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_5U>,_0>
  local_158;
  
  bVar8 = 0;
  local_530 = (vectors->
              super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>)
              .super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_cols.m_value;
  local_548 = vectors;
  local_540 = (DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
               *)hCoeffs;
  if ((((triFactor->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>).m_storage.
        m_rows == local_530) &&
      ((triFactor->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>).m_storage.m_cols
       == local_530)) &&
     (local_530 <=
      (vectors->
      super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
      super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
      m_value)) {
    index = local_530 - 1;
    local_538 = index;
    for (; xpr = local_548, -1 < (long)index; index = index - 1) {
      lVar7 = local_530 + ~index;
      if (0 < lVar7) {
        lVar4 = ~index + (local_548->
                         super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                         ).
                         super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                         .m_rows.m_value;
        local_54c = DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>
                    ::operator()(local_540,index);
        local_54c = -local_54c;
        Block<const_Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>
        ::Block(&local_4b8,xpr,index);
        DenseBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>_>
        ::tail<long>(&local_418,
                     (DenseBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
                      *)&local_4b8,lVar4);
        memcpy(local_380,&local_418,0x98);
        Eigen::operator*(&local_2e8,&local_54c,local_380);
        DenseBase<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,-1,false>>::
        bottomRightCorner<long,long>(&local_1c0,xpr,lVar4,lVar7);
        pTVar5 = &local_1c0;
        pRVar6 = (Rhs *)&z;
        for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
          (pRVar6->m_matrix).
          super_BlockImpl<const_Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_data = (pTVar5->
                    super_BlockImpl<const_Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                    ).
                    super_BlockImpl_dense<const_Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
                    .m_data;
          pTVar5 = (Type *)((long)pTVar5 + ((ulong)bVar8 * -2 + 1) * 8);
          pRVar6 = (Rhs *)((long)pRVar6 + ((ulong)bVar8 * -2 + 1) * 8);
        }
        Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>,_Eigen::TriangularView<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_5U>,_0>
        ::Product(&local_158,&local_2e8,(Rhs *)&z);
        Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
                  ((Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true> *)local_450,
                   triFactor,index);
        DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>::tail<long>
                  (&local_228,local_450,lVar7);
        local_528 = &local_228;
        NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,1,-1,-1>,1,-1,true>,1,-1,false>,Eigen::MatrixBase>
        ::operator=((NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>,Eigen::MatrixBase>
                     *)&local_528,
                    (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>,_Eigen::TriangularView<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_5U>,_0>_>
                     *)&local_158);
        lVar7 = 0;
        for (col = local_538; (long)index < (long)col; col = col - 1) {
          pSVar3 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1> *)
                              triFactor,index,col);
          fVar1 = *pSVar3;
          z = fVar1;
          pSVar3 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1> *)
                              triFactor,col,col);
          fVar2 = *pSVar3;
          pSVar3 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1> *)
                              triFactor,index,col);
          *pSVar3 = fVar1 * fVar2;
          if (0 < lVar7) {
            Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
                      ((Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true> *)&local_418,
                       triFactor,col);
            DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>::
            tail<long>((Type *)&local_2e8,
                       (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                        *)&local_418,lVar7);
            Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>
                              *)&local_158,&z,(StorageBaseType *)&local_2e8);
            Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
                      ((Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true> *)&local_4b8,
                       triFactor,index);
            DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>::
            tail<long>((Type *)local_380,
                       (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                        *)&local_4b8,lVar7);
            MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,1,-1,-1>,1,-1,true>,1,-1,false>>
            ::operator+=((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>>
                          *)local_380,
                         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>_>
                          *)&local_158);
          }
          lVar7 = lVar7 + 1;
        }
      }
      CVar9 = DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>
              ::operator()(local_540,index);
      pSVar3 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1> *)triFactor,
                          index,index);
      *pSVar3 = CVar9;
    }
    return;
  }
  __assert_fail("triFactor.rows() == nbVecs && triFactor.cols() == nbVecs && vectors.rows()>=nbVecs"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Householder/BlockHouseholder.h"
                ,0x36,
                "void Eigen::internal::make_block_householder_triangular_factor(TriangularFactorType &, const VectorsType &, const CoeffsType &) [TriangularFactorType = Eigen::Matrix<float, -1, -1, 1, -1, -1>, VectorsType = Eigen::Block<Eigen::Matrix<float, -1, -1>>, CoeffsType = Eigen::Block<const Eigen::Matrix<float, -1, 1>, -1, 1>]"
               );
}

Assistant:

void make_block_householder_triangular_factor(TriangularFactorType& triFactor, const VectorsType& vectors, const CoeffsType& hCoeffs)
{
  const Index nbVecs = vectors.cols();
  eigen_assert(triFactor.rows() == nbVecs && triFactor.cols() == nbVecs && vectors.rows()>=nbVecs);

  for(Index i = nbVecs-1; i >=0 ; --i)
  {
    Index rs = vectors.rows() - i - 1;
    Index rt = nbVecs-i-1;

    if(rt>0)
    {
      triFactor.row(i).tail(rt).noalias() = -hCoeffs(i) * vectors.col(i).tail(rs).adjoint()
                                                        * vectors.bottomRightCorner(rs, rt).template triangularView<UnitLower>();
            
      // FIXME use the following line with .noalias() once the triangular product can work inplace
      // triFactor.row(i).tail(rt) = triFactor.row(i).tail(rt) * triFactor.bottomRightCorner(rt,rt).template triangularView<Upper>();
      for(Index j=nbVecs-1; j>i; --j)
      {
        typename TriangularFactorType::Scalar z = triFactor(i,j);
        triFactor(i,j) = z * triFactor(j,j);
        if(nbVecs-j-1>0)
          triFactor.row(i).tail(nbVecs-j-1) += z * triFactor.row(j).tail(nbVecs-j-1);
      }
      
    }
    triFactor(i,i) = hCoeffs(i);
  }
}